

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Trivia __thiscall
slang::parsing::Preprocessor::parseBranchDirective
          (Preprocessor *this,Token directive,Token condition,bool taken)

{
  SmallVector<slang::parsing::Token,_2UL> *this_00;
  BumpAllocator *this_01;
  Token TVar1;
  SyntaxKind SVar2;
  int iVar3;
  undefined4 extraout_var;
  ConditionalBranchDirectiveSyntax *syntax;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *src;
  Info *extraout_RDX;
  EVP_PKEY_CTX *src_00;
  Info *extraout_RDX_00;
  Info *pIVar4;
  undefined3 in_register_00000089;
  SourceRange range;
  SyntaxKind local_6c;
  Token token;
  Token directive_local;
  Token condition_local;
  Trivia local_38;
  
  pIVar4 = condition.info;
  condition_local._0_8_ = condition._0_8_;
  directive_local.info = directive.info;
  directive_local._0_8_ = directive._0_8_;
  this_00 = &this->scratchTokenBuffer;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  condition_local.info = pIVar4;
  if (CONCAT31(in_register_00000089,taken) == 0) {
    do {
      token = nextRaw(this);
      if (token.kind == Directive) {
        SVar2 = Token::directiveKind(&token);
        if ((SVar2 - ElsIfDirective < 0x40) &&
           ((0xa000000000004009U >> ((ulong)(SVar2 - ElsIfDirective) & 0x3f) & 1) != 0))
        goto LAB_0017bd9e;
      }
      else if (token.kind == EndOfFile) goto LAB_0017bd81;
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                (&this_00->super_SmallVectorBase<slang::parsing::Token>,&token);
    } while( true );
  }
LAB_0017bdaa:
  this_01 = this->alloc;
  if (pIVar4 == (Info *)0x0) {
    local_6c = Token::directiveKind(&directive_local);
    iVar3 = SmallVectorBase<slang::parsing::Token>::copy
                      (&this_00->super_SmallVectorBase<slang::parsing::Token>,
                       (EVP_PKEY_CTX *)this->alloc,src_00);
    token.rawLen = extraout_var_00;
    token.kind = (short)iVar3;
    token._2_1_ = (char)((uint)iVar3 >> 0x10);
    token.numFlags.raw = (char)((uint)iVar3 >> 0x18);
    token.info = extraout_RDX_00;
    syntax = (ConditionalBranchDirectiveSyntax *)
             BumpAllocator::
             emplace<slang::syntax::UnconditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind,slang::parsing::Token&,nonstd::span_lite::span<slang::parsing::Token,18446744073709551615ul>>
                       (this_01,&local_6c,&directive_local,
                        (span<slang::parsing::Token,_18446744073709551615UL> *)&token);
  }
  else {
    local_6c = Token::directiveKind(&directive_local);
    iVar3 = SmallVectorBase<slang::parsing::Token>::copy
                      (&this_00->super_SmallVectorBase<slang::parsing::Token>,
                       (EVP_PKEY_CTX *)this->alloc,src);
    token.rawLen = extraout_var;
    token.kind = (short)iVar3;
    token._2_1_ = (char)((uint)iVar3 >> 0x10);
    token.numFlags.raw = (char)((uint)iVar3 >> 0x18);
    token.info = extraout_RDX;
    syntax = BumpAllocator::
             emplace<slang::syntax::ConditionalBranchDirectiveSyntax,slang::syntax::SyntaxKind,slang::parsing::Token&,slang::parsing::Token&,nonstd::span_lite::span<slang::parsing::Token,18446744073709551615ul>>
                       (this_01,&local_6c,&directive_local,&condition_local,
                        (span<slang::parsing::Token,_18446744073709551615UL> *)&token);
  }
  Trivia::Trivia(&local_38,Directive,(SyntaxNode *)syntax);
  return local_38;
LAB_0017bd81:
  range = Token::range(&directive_local);
  addDiag(this,(DiagCode)0x120004,range);
LAB_0017bd9e:
  TVar1 = token;
  (this->currentToken).kind = token.kind;
  (this->currentToken).field_0x2 = token._2_1_;
  (this->currentToken).numFlags = (NumericTokenFlags)token.numFlags.raw;
  (this->currentToken).rawLen = token.rawLen;
  (this->currentToken).info = token.info;
  token = TVar1;
  goto LAB_0017bdaa;
}

Assistant:

Trivia Preprocessor::parseBranchDirective(Token directive, Token condition, bool taken) {
    scratchTokenBuffer.clear();
    if (!taken) {
        // skip over everything until we find another conditional compilation directive
        while (true) {
            auto token = nextRaw();

            // EoF or conditional directive stops the skipping process
            bool done = false;
            if (token.kind == TokenKind::EndOfFile) {
                addDiag(diag::MissingEndIfDirective, directive.range());
                done = true;
            }
            else if (token.kind == TokenKind::Directive) {
                switch (token.directiveKind()) {
                    case SyntaxKind::IfDefDirective:
                    case SyntaxKind::IfNDefDirective:
                    case SyntaxKind::ElsIfDirective:
                    case SyntaxKind::ElseDirective:
                    case SyntaxKind::EndIfDirective:
                        done = true;
                        break;
                    default:
                        break;
                }
            }

            if (done) {
                // put the token back so that we'll look at it next
                currentToken = token;
                break;
            }
            scratchTokenBuffer.push_back(token);
        }
    }

    SyntaxNode* syntax;
    if (condition) {
        syntax = alloc.emplace<ConditionalBranchDirectiveSyntax>(directive.directiveKind(),
                                                                 directive, condition,
                                                                 scratchTokenBuffer.copy(alloc));
    }
    else {
        syntax = alloc.emplace<UnconditionalBranchDirectiveSyntax>(directive.directiveKind(),
                                                                   directive,
                                                                   scratchTokenBuffer.copy(alloc));
    }
    return Trivia(TriviaKind::Directive, syntax);
}